

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O2

int __thiscall
Al::internal::ProgressEngine::bind(ProgressEngine *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  hwloc_topology_t phVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  hwloc_cpuset_t phVar6;
  long lVar7;
  undefined8 uVar8;
  MPICommunicator *pMVar9;
  ostream *poVar10;
  undefined4 in_register_00000034;
  char *pcVar11;
  int iVar12;
  hwloc_topology_t topo;
  hwloc_cpuset_t cpuset;
  
  if (this->core_to_bind < 0) {
    pMVar9 = mpi::get_world_comm();
    poVar10 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)&std::cerr,
                         (pMVar9->super_MPICommAndStreamWrapper<int>).rank_in_comm);
    poVar10 = std::operator<<(poVar10,": progress engine binding not initialized");
    poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
    return (int)poVar10;
  }
  hwloc_topology_init(&topo,CONCAT44(in_register_00000034,__fd));
  hwloc_topology_load(topo);
  phVar6 = (hwloc_cpuset_t)hwloc_bitmap_alloc();
  cpuset = phVar6;
  bVar2 = anon_unknown_5::get_hwloc_cpuset(&cpuset,&topo);
  phVar1 = topo;
  if (bVar2) {
    iVar5 = this->core_to_bind;
    uVar3 = hwloc_get_type_depth(topo,2);
    if (uVar3 < 0xfffffffe) {
      iVar12 = 0;
      lVar7 = hwloc_get_obj_by_depth(phVar1,uVar3,0);
      if (lVar7 != 0) {
        for (; lVar7 != 0; lVar7 = *(long *)(lVar7 + 0x38)) {
          uVar8 = *(undefined8 *)(lVar7 + 0xb8);
          iVar4 = hwloc_bitmap_iszero(uVar8);
          if ((iVar4 == 0) && (iVar4 = hwloc_bitmap_isincluded(uVar8,phVar6), iVar4 != 0)) {
            if (iVar12 == iVar5) {
              uVar8 = hwloc_bitmap_dup(uVar8);
              hwloc_bitmap_singlify(uVar8);
              iVar5 = hwloc_set_cpubind(topo,uVar8,2);
              if (iVar5 == -1) {
                pMVar9 = mpi::get_world_comm();
                poVar10 = (ostream *)
                          std::ostream::operator<<
                                    ((ostream *)&std::cerr,
                                     (pMVar9->super_MPICommAndStreamWrapper<int>).rank_in_comm);
                poVar10 = std::operator<<(poVar10,": failed to bind progress thread");
                std::endl<char,std::char_traits<char>>(poVar10);
              }
              hwloc_bitmap_free(uVar8);
              goto LAB_0010deb2;
            }
            iVar12 = iVar12 + 1;
          }
        }
      }
    }
    pMVar9 = mpi::get_world_comm();
    poVar10 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)&std::cerr,
                         (pMVar9->super_MPICommAndStreamWrapper<int>).rank_in_comm);
    poVar10 = std::operator<<(poVar10,": could not get core ");
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,this->core_to_bind);
    pcVar11 = "; not binding progress thread";
  }
  else {
    pMVar9 = mpi::get_world_comm();
    poVar10 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)&std::cerr,
                         (pMVar9->super_MPICommAndStreamWrapper<int>).rank_in_comm);
    pcVar11 = ": Could not get starting cpuset; not binding progress thread";
  }
  poVar10 = std::operator<<(poVar10,pcVar11);
  std::endl<char,std::char_traits<char>>(poVar10);
LAB_0010deb2:
  hwloc_bitmap_free(phVar6);
  iVar5 = hwloc_topology_destroy(topo);
  return iVar5;
}

Assistant:

void ProgressEngine::bind() {
  if (core_to_bind < 0) {
    std::cerr << mpi::get_world_comm().rank()
              << ": progress engine binding not initialized"
              << std::endl;
    return;
  }

  hwloc_topology_t topo;
  hwloc_topology_init(&topo);
  hwloc_topology_load(topo);
  hwloc_cpuset_t cpuset = hwloc_bitmap_alloc();
  if (!get_hwloc_cpuset(cpuset, topo)) {
    std::cerr << mpi::get_world_comm().rank()
              << ": Could not get starting cpuset; not binding progress thread"
              << std::endl;
    hwloc_bitmap_free(cpuset);
    hwloc_topology_destroy(topo);
    return;
  }

  hwloc_obj_t core = hwloc_get_obj_inside_cpuset_by_type(
    topo, cpuset, HWLOC_OBJ_CORE, core_to_bind);
  if (core == NULL) {
    std::cerr << mpi::get_world_comm().rank()
              << ": could not get core "
              << core_to_bind
              << "; not binding progress thread"
              << std::endl;
    hwloc_bitmap_free(cpuset);
    hwloc_topology_destroy(topo);
    return;
  }
  hwloc_cpuset_t coreset = hwloc_bitmap_dup(core->cpuset);
  hwloc_bitmap_singlify(coreset);
  if (hwloc_set_cpubind(topo, coreset, HWLOC_CPUBIND_THREAD) == -1) {
    std::cerr << mpi::get_world_comm().rank()
              << ": failed to bind progress thread"
              << std::endl;
  }

  hwloc_bitmap_free(coreset);
  hwloc_bitmap_free(cpuset);
  hwloc_topology_destroy(topo);
}